

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintMessageEnd_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,Message *message,int field_index,
          int field_count,bool single_line_mode)

{
  char *local_58;
  allocator local_2a;
  undefined1 local_29;
  int local_28;
  int iStack_24;
  bool single_line_mode_local;
  int field_count_local;
  int field_index_local;
  Message *message_local;
  FieldValuePrinter *this_local;
  
  if (single_line_mode) {
    local_58 = "} ";
  }
  else {
    local_58 = "}\n";
  }
  local_29 = single_line_mode;
  local_28 = field_count;
  iStack_24 = field_index;
  _field_count_local = message;
  message_local = (Message *)this;
  this_local = (FieldValuePrinter *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_58,&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  return __return_storage_ptr__;
}

Assistant:

string TextFormat::FieldValuePrinter::PrintMessageEnd(
    const Message& message,
    int field_index,
    int field_count,
    bool single_line_mode) const {
  return single_line_mode ? "} " : "}\n";
}